

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Configlist_eat(config *cfp)

{
  config *pcVar1;
  config *nextcfp;
  config *cfp_local;
  
  nextcfp = cfp;
  while( true ) {
    if (nextcfp == (config *)0x0) {
      return;
    }
    pcVar1 = nextcfp->next;
    if (nextcfp->fplp != (plink *)0x0) break;
    if (nextcfp->bplp != (plink *)0x0) {
      __assert_fail("cfp->bplp==0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                    ,0x545,"void Configlist_eat(struct config *)");
    }
    if (nextcfp->fws != (char *)0x0) {
      SetFree(nextcfp->fws);
    }
    deleteconfig(nextcfp);
    nextcfp = pcVar1;
  }
  __assert_fail("cfp->fplp==0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                ,0x544,"void Configlist_eat(struct config *)");
}

Assistant:

void Configlist_eat(struct config *cfp)
{
  struct config *nextcfp;
  for(; cfp; cfp=nextcfp){
    nextcfp = cfp->next;
    assert( cfp->fplp==0 );
    assert( cfp->bplp==0 );
    if( cfp->fws ) SetFree(cfp->fws);
    deleteconfig(cfp);
  }
  return;
}